

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# placeholder_impl.cpp
# Opt level: O2

void __thiscall ui::PlaceHolderImpl::~PlaceHolderImpl(PlaceHolderImpl *this)

{
  (this->super_PanelBase).super_ComponentBase._vptr_ComponentBase =
       (_func_int **)&PTR__PlaceHolderImpl_00167718;
  std::__cxx11::string::~string((string *)&this->title_);
  ftxui::ComponentBase::~ComponentBase((ComponentBase *)this);
  return;
}

Assistant:

PlaceHolderImpl(std::string title) : title_(title) {}